

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_views.cpp
# Opt level: O1

void populate_container(char_array_list *data,size_t element_count)

{
  buffer_t<char> *this;
  memory_resource *pmVar1;
  ulong uVar2;
  ulong uVar3;
  ushort *puVar4;
  ushort uVar5;
  long lVar6;
  undefined8 unaff_R12;
  ulong uVar7;
  ulong uVar8;
  char *new_buffer;
  size_t new_buffer_size;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_vladp72[P]iffl_include_iffl_list_h:5640:33)>
  deallocate_buffer;
  char *local_88;
  size_t local_80;
  size_t local_78;
  char_array_list *local_70;
  undefined8 *local_68;
  size_t *local_60;
  char local_58;
  sizes_t local_50;
  
  local_78 = element_count;
  if (element_count != 0) {
    this = &(data->buffer_).v2_;
    uVar7 = CONCAT62((int6)((ulong)unaff_R12 >> 0x10),1);
    uVar8 = 0;
    do {
      iffl::buffer_t<char>::validate(this);
      local_88 = (char *)0x0;
      local_80 = 0;
      local_60 = &local_80;
      local_58 = '\x01';
      local_70 = data;
      local_68 = &local_88;
      iffl::
      flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
      ::get_all_sizes(&local_50,data);
      uVar3 = local_50.last_element.super_range.data_end + 1 & 0xfffffffffffffffe;
      uVar2 = local_50.total_capacity - uVar3;
      if (local_50.total_capacity < uVar3) {
        uVar2 = 0;
      }
      lVar6 = (uVar8 + 2) - uVar2;
      if (uVar8 + 2 < uVar2 || lVar6 == 0) {
        puVar4 = (ushort *)(this->begin + uVar3);
      }
      else {
        local_80 = lVar6 + (local_50.total_capacity + 1 & 0xfffffffffffffffe);
        pmVar1 = (data->buffer_).v1_._M_resource;
        local_88 = (char *)(**(code **)(*(long *)pmVar1 + 0x10))(pmVar1,local_80,1);
        puVar4 = (ushort *)
                 (local_88 + (local_50.last_element.super_range.data_end + 1 & 0xfffffffffffffffe));
      }
      uVar5 = (short)uVar7 - 1;
      *puVar4 = uVar5;
      if ((short)uVar7 != 1) {
        memset(puVar4 + 1,(int)uVar7,(long)puVar4 + (uVar8 - (long)(puVar4 + 1)) + 2);
      }
      if (uVar5 < *puVar4) {
        std::terminate();
      }
      if (local_88 != (char *)0x0) {
        if (this->begin != (pointer_type)0x0) {
          memcpy(local_88,this->begin,local_50.last_element.super_range.data_end);
        }
        iffl::
        flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
        ::commit_new_buffer(data,&local_88,&local_80);
      }
      (data->buffer_).v2_.last = (pointer_type)puVar4;
      iffl::buffer_t<char>::validate(this);
      iffl::
      flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
      ::validate_data_invariants(data);
      if (local_58 == '\x01') {
        if ((char *)*local_68 != (char *)0x0) {
          iffl::
          flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
          ::deallocate_buffer(local_70,(char *)*local_68,*local_60);
          *local_68 = 0;
          *local_60 = 0;
        }
        local_58 = '\0';
      }
      uVar8 = uVar7 & 0xffff;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (uVar8 < local_78);
  }
  printf("Created collection with %zu elements\n",local_78);
  return;
}

Assistant:

void populate_container(char_array_list &data, size_t element_count) noexcept {
    for (unsigned short idx = 0; idx < element_count; ++idx) {
        size_t element_size{ char_array_list::traits::minimum_size() + idx * sizeof(char_array_list::value_type::type) };
        data.emplace_back(element_size,
                          [&idx] (char_array_list_entry &e,
                                  size_t element_size) noexcept {
                              e.length = idx;
                              std::fill(e.arr, e.arr + e.length, static_cast<char>(idx)+1);
                          });
    }
    std::printf("Created collection with %zu elements\n", element_count);
}